

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.h
# Opt level: O1

size_t __thiscall Messages::Person::RequiredFieldsByteSizeFallback(Person *this)

{
  size_type sVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar4 = (this->_has_bits_).has_bits_[0];
  if ((uVar4 & 1) == 0) {
    sVar3 = 0;
  }
  else {
    sVar1 = ((this->name_).ptr_)->_M_string_length;
    uVar6 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar3 = sVar1 + (iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if ((uVar4 & 4) != 0) {
    if (this->id_ < 0) {
      uVar5 = 0xb;
    }
    else {
      uVar4 = this->id_ | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar5 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    sVar3 = sVar3 + uVar5;
  }
  return sVar3;
}

Assistant:

inline bool Person::_internal_has_name() const {
  bool value = (_has_bits_[0] & 0x00000001u) != 0;
  return value;
}